

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode AllowServerConnect(connectdata *conn,_Bool *connected)

{
  SessionHandle *data;
  CURLcode CVar1;
  long lVar2;
  long milli;
  
  data = conn->data;
  *connected = false;
  Curl_infof(data,"Preparing for accepting server on data port\n");
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  lVar2 = ftp_timeleft_accept(data);
  if (lVar2 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    CVar1 = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    CVar1 = ReceivedServerConnect(conn,connected);
    if (CVar1 == CURLE_OK) {
      if (*connected == true) {
        CVar1 = AcceptServerConnect(conn);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        CVar1 = InitiateTransfer(conn);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
      }
      else {
        lVar2 = (data->set).accepttimeout;
        milli = 60000;
        if (0 < lVar2) {
          milli = lVar2;
        }
        Curl_expire(data,milli);
      }
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode AllowServerConnect(struct connectdata *conn, bool *connected)
{
  struct SessionHandle *data = conn->data;
  long timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port\n");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(conn, connected);
  if(result)
    return result;

  if(*connected) {
    result = AcceptServerConnect(conn);
    if(result)
      return result;

    result = InitiateTransfer(conn);
    if(result)
      return result;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    if(!result && *connected == FALSE) {
      if(data->set.accepttimeout > 0)
        Curl_expire(data, data->set.accepttimeout);
      else
        Curl_expire(data, DEFAULT_ACCEPT_TIMEOUT);
    }
  }

  return result;
}